

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::PluralRules::getKeywordOther(UnicodeString *__return_storage_ptr__,PluralRules *this)

{
  ConstChar16Ptr local_20;
  PluralRules *local_18;
  PluralRules *this_local;
  
  local_18 = this;
  this_local = (PluralRules *)__return_storage_ptr__;
  ConstChar16Ptr::ConstChar16Ptr(&local_20,(char16_t *)PLURAL_KEYWORD_OTHER);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_20,5);
  ConstChar16Ptr::~ConstChar16Ptr(&local_20);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PluralRules::getKeywordOther() const {
    return UnicodeString(TRUE, PLURAL_KEYWORD_OTHER, 5);
}